

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

string * __thiscall
nlohmann::detail::
parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::exception_message(string *__return_storage_ptr__,
                   parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                   *this,token_type expected,string *context)

{
  size_type *psVar1;
  long *plVar2;
  undefined8 *puVar3;
  char *pcVar4;
  long *plVar5;
  ulong *puVar6;
  long *plVar7;
  ulong uVar8;
  undefined8 uVar9;
  long *local_d8;
  long local_c8;
  long lStack_c0;
  allocator<char> local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  ulong *local_90;
  long local_88;
  ulong local_80;
  long lStack_78;
  string local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50 [2];
  size_type local_40 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,"syntax error ","");
  if (context->_M_string_length != 0) {
    std::operator+(&local_b0,"while parsing ",context);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_b0);
    plVar5 = plVar2 + 2;
    if ((long *)*plVar2 == plVar5) {
      local_c8 = *plVar5;
      lStack_c0 = plVar2[3];
      local_d8 = &local_c8;
    }
    else {
      local_c8 = *plVar5;
      local_d8 = (long *)*plVar2;
    }
    *plVar2 = (long)plVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_d8);
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,local_c8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (this->last_token == parse_error) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_50,(this->m_lexer).error_message,&local_b1);
    plVar2 = (long *)std::__cxx11::string::append((char *)local_50);
    puVar6 = (ulong *)(plVar2 + 2);
    if ((ulong *)*plVar2 == puVar6) {
      local_80 = *puVar6;
      lStack_78 = plVar2[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *puVar6;
      local_90 = (ulong *)*plVar2;
    }
    local_88 = plVar2[1];
    *plVar2 = (long)puVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::get_token_string(&local_70,&this->m_lexer);
    uVar8 = 0xf;
    if (local_90 != &local_80) {
      uVar8 = local_80;
    }
    if (uVar8 < local_70._M_string_length + local_88) {
      uVar9 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        uVar9 = local_70.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar9 < local_70._M_string_length + local_88) goto LAB_0017f823;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_90);
    }
    else {
LAB_0017f823:
      puVar3 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_70._M_dataplus._M_p);
    }
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    psVar1 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar1) {
      local_b0.field_2._M_allocated_capacity = *psVar1;
      local_b0.field_2._8_8_ = puVar3[3];
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar1;
      local_b0._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_b0._M_string_length = puVar3[1];
    *puVar3 = psVar1;
    puVar3[1] = 0;
    *(undefined1 *)psVar1 = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_b0);
    plVar5 = plVar2 + 2;
    if ((long *)*plVar2 == plVar5) {
      local_c8 = *plVar5;
      lStack_c0 = plVar2[3];
      local_d8 = &local_c8;
    }
    else {
      local_c8 = *plVar5;
      local_d8 = (long *)*plVar2;
    }
    *plVar2 = (long)plVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_d8);
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,local_c8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50[0] ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40) goto LAB_0017f9d2;
  }
  else {
    pcVar4 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             ::token_type_name(this->last_token);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,pcVar4,(allocator<char> *)&local_90);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x1f73d6);
    plVar5 = plVar2 + 2;
    if ((long *)*plVar2 == plVar5) {
      local_c8 = *plVar5;
      lStack_c0 = plVar2[3];
      local_d8 = &local_c8;
    }
    else {
      local_c8 = *plVar5;
      local_d8 = (long *)*plVar2;
    }
    *plVar2 = (long)plVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_d8);
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,local_c8 + 1);
    }
    local_40[0] = local_b0.field_2._M_allocated_capacity;
    local_50[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == &local_b0.field_2) goto LAB_0017f9d2;
  }
  operator_delete(local_50[0],local_40[0] + 1);
LAB_0017f9d2:
  if (expected != uninitialized) {
    pcVar4 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             ::token_type_name(expected);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,pcVar4,(allocator<char> *)&local_90);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x1f73e2);
    plVar5 = plVar2 + 2;
    if ((long *)*plVar2 == plVar5) {
      local_c8 = *plVar5;
      lStack_c0 = plVar2[3];
      plVar7 = &local_c8;
    }
    else {
      local_c8 = *plVar5;
      plVar7 = (long *)*plVar2;
    }
    *plVar2 = (long)plVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)plVar7);
    if (plVar7 != &local_c8) {
      operator_delete(plVar7,local_c8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string exception_message(const token_type expected, const std::string& context)
    {
        std::string error_msg = "syntax error ";

        if (not context.empty())
        {
            error_msg += "while parsing " + context + " ";
        }

        error_msg += "- ";

        if (last_token == token_type::parse_error)
        {
            error_msg += std::string(m_lexer.get_error_message()) + "; last read: '" +
                         m_lexer.get_token_string() + "'";
        }
        else
        {
            error_msg += "unexpected " + std::string(lexer_t::token_type_name(last_token));
        }

        if (expected != token_type::uninitialized)
        {
            error_msg += "; expected " + std::string(lexer_t::token_type_name(expected));
        }

        return error_msg;
    }